

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuda_finder.cpp
# Opt level: O0

path * __thiscall
CudaFinder::get_install_dir(path *__return_storage_ptr__,CudaFinder *this,path *path_)

{
  bool bVar1;
  __type _Var2;
  string local_98;
  reference local_78;
  path *p;
  iterator __end1;
  undefined1 local_48 [8];
  iterator __begin1;
  path *__range1;
  path *path__local;
  CudaFinder *this_local;
  path *o_path;
  
  std::filesystem::__cxx11::path::path(__return_storage_ptr__);
  __begin1._16_8_ = path_;
  std::filesystem::__cxx11::path::begin((iterator *)local_48,path_);
  std::filesystem::__cxx11::path::end((iterator *)&p,(path *)__begin1._16_8_);
  while( true ) {
    bVar1 = std::filesystem::__cxx11::operator!=((iterator *)local_48,(iterator *)&p);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    local_78 = std::filesystem::__cxx11::path::iterator::operator*((iterator *)local_48);
    std::filesystem::__cxx11::path::string(&local_98,local_78);
    _Var2 = std::operator==(&local_98,&this->m_target_version);
    std::__cxx11::string::~string((string *)&local_98);
    if (_Var2) break;
    std::filesystem::__cxx11::path::operator/=(__return_storage_ptr__,local_78);
    std::filesystem::__cxx11::path::iterator::operator++((iterator *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

fs::path CudaFinder::get_install_dir(const fs::path &path_)
{
  fs::path o_path;
  for (auto &p : path_)
    if (p.string() == m_target_version)
      break;
    else
      o_path /= p;
  return o_path;
}